

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.h
# Opt level: O1

void __thiscall Clasp::SharedContext::add(SharedContext *this,Constraint *c)

{
  if (((this->share_).field_0x3 & 2) == 0) {
    Solver::add(*(this->solvers_).ebo_.buf,c);
    return;
  }
  Potassco::fail(-2,"void Clasp::SharedContext::add(Constraint *)",0x3de,"!frozen()",(char *)0x0);
}

Assistant:

bool       frozen()             const { return share_.frozen;}